

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_lemire(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  size_t i;
  long lVar3;
  ulong uVar4;
  size_t i_1;
  long lVar5;
  size_t k_1;
  long lVar6;
  uint16_t auVar7 [16];
  undefined1 auVar8 [64];
  uint16_t buffer [16];
  
  auVar2 = _DAT_0010fa20;
  if (len < 0x40) {
    pospopcnt_u16_scalar_naive(array,len,flags);
  }
  else {
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    auVar7 = auVar8._0_32_;
    buffer[0] = auVar7[0];
    buffer[1] = auVar7[1];
    buffer[2] = auVar7[2];
    buffer[3] = auVar7[3];
    buffer[4] = auVar7[4];
    buffer[5] = auVar7[5];
    buffer[6] = auVar7[6];
    buffer[7] = auVar7[7];
    buffer[8] = auVar7[8];
    buffer[9] = auVar7[9];
    buffer[10] = auVar7[10];
    buffer[0xb] = auVar7[0xb];
    buffer[0xc] = auVar7[0xc];
    buffer[0xd] = auVar7[0xd];
    buffer[0xe] = auVar7[0xe];
    buffer[0xf] = auVar7[0xf];
    lVar3 = 1;
    while (lVar3 != 0x10) {
      auVar1 = vpand_avx2(_DAT_0010fa20,*(undefined1 (*) [32])(buffer + lVar3));
      lVar3 = lVar3 + 1;
      auVar1 = vpcmpeqw_avx2(auVar1,_DAT_0010fa20);
      auVar1 = vpsubw_avx2(auVar8._0_32_,auVar1);
      auVar8 = ZEXT3264(auVar1);
    }
    uVar4 = (ulong)len;
    buffer = *(uint16_t (*) [16])(array + (uVar4 - 0x10));
    lVar3 = 1;
    while (auVar7 = auVar8._0_32_, lVar3 != 0x10) {
      auVar1 = vpand_avx2(_DAT_0010fa20,*(undefined1 (*) [32])(buffer + lVar3));
      lVar3 = lVar3 + 1;
      auVar1 = vpcmpeqw_avx2(auVar1,_DAT_0010fa20);
      auVar1 = vpsubw_avx2((undefined1  [32])auVar7,auVar1);
      auVar8 = ZEXT3264(auVar1);
    }
    buffer[0] = auVar7[0];
    buffer[1] = auVar7[1];
    buffer[2] = auVar7[2];
    buffer[3] = auVar7[3];
    buffer[4] = auVar7[4];
    buffer[5] = auVar7[5];
    buffer[6] = auVar7[6];
    buffer[7] = auVar7[7];
    buffer[8] = auVar7[8];
    buffer[9] = auVar7[9];
    buffer[10] = auVar7[10];
    buffer[0xb] = auVar7[0xb];
    buffer[0xc] = auVar7[0xc];
    buffer[0xd] = auVar7[0xd];
    buffer[0xe] = auVar7[0xe];
    buffer[0xf] = auVar7[0xf];
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      flags[lVar3] = flags[lVar3] + (uint)buffer[lVar3];
    }
    for (lVar3 = 0; lVar3 + 0x10U <= uVar4; lVar3 = lVar3 + lVar5) {
      lVar5 = (uVar4 - 0xf) - lVar3;
      auVar8 = ZEXT1664((undefined1  [16])0x0);
      if (lVar3 + 0x1000fU < uVar4) {
        lVar5 = 0xffff;
      }
      lVar6 = 0;
      while (auVar7 = auVar8._0_32_, lVar5 != lVar6) {
        auVar1 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + lVar6));
        lVar6 = lVar6 + 1;
        auVar1 = vpcmpeqw_avx2(auVar1,auVar2);
        auVar1 = vpsubw_avx2((undefined1  [32])auVar7,auVar1);
        auVar8 = ZEXT3264(auVar1);
      }
      buffer[0] = auVar7[0];
      buffer[1] = auVar7[1];
      buffer[2] = auVar7[2];
      buffer[3] = auVar7[3];
      buffer[4] = auVar7[4];
      buffer[5] = auVar7[5];
      buffer[6] = auVar7[6];
      buffer[7] = auVar7[7];
      buffer[8] = auVar7[8];
      buffer[9] = auVar7[9];
      buffer[10] = auVar7[10];
      buffer[0xb] = auVar7[0xb];
      buffer[0xc] = auVar7[0xc];
      buffer[0xd] = auVar7[0xd];
      buffer[0xe] = auVar7[0xe];
      buffer[0xf] = auVar7[0xf];
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        flags[lVar6] = flags[lVar6] + (uint)buffer[lVar6];
      }
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_lemire(const uint16_t* array, uint32_t len, uint32_t* flags) {
    uint16_t buffer[16];
    __m256i bits = _mm256_set_epi16(-32768, 16384, 8192, 4096, 2048, 1024, 512, 256,
                                       128,    64,   32,   16,    8,    4,   2,   1);
    // we do the first part
    if (len < 64) {
        // don't bother with handcrafted SIMD
        pospopcnt_u16_scalar_naive(array, len, flags);
        return 0;
    }
    // handle the start (naively)
    __m256i count16 = _mm256_setzero_si256();

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer + 16, array, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer, array + len - 16, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }
    
    _mm256_storeu_si256((__m256i*)buffer, count16);
    for (size_t k = 0; k < 16; k++) {
        flags[k] += buffer[k];
    }

    // main loop starts here
    for (size_t i = 0; i + 16 <= len;) {
        count16 = _mm256_setzero_si256();
        size_t j = 0;
        size_t maxj = 65535;

        if (maxj + i + 16 >= len)
            maxj = len - i - 15;

        for (/**/; j < maxj; ++j) {
            __m256i input = _mm256_loadu_si256((__m256i*)(array + i + j));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
        i += j;
        _mm256_storeu_si256((__m256i*)buffer, count16);
        for (size_t k = 0; k < 16; k++) {
            flags[k] += buffer[k];
        }
    }
    return 0;
}